

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosType.h
# Opt level: O0

void __thiscall adios2::helper::DimsArray::DimsArray(DimsArray *this,size_t count,size_t init)

{
  size_t in_RDX;
  ulong in_RSI;
  CoreDims *in_RDI;
  size_t i;
  size_t **local_28;
  ulong local_20;
  
  CoreDims::CoreDims(in_RDI,in_RSI,&in_RDI[1].DimCount);
  in_RDI[1].DimCount = 0;
  local_28 = &in_RDI[1].DimensSpan;
  do {
    *local_28 = (size_t *)0x0;
    local_28 = local_28 + 1;
  } while ((CoreDims *)local_28 != in_RDI + 0x11);
  for (local_20 = 0; local_20 < in_RSI; local_20 = local_20 + 1) {
    (&in_RDI[1].DimCount)[local_20] = in_RDX;
  }
  return;
}

Assistant:

DimsArray(const size_t count, const size_t init) : CoreDims(count, &Dimensions[0])
    {
        for (size_t i = 0; i < count; i++)
        {
            Dimensions[i] = init;
        }
    }